

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

string * __thiscall
FileSystemUtils::Path::Extension_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string local_58 [32];
  ulong local_38;
  size_t pos;
  undefined1 local_19;
  Path *local_18;
  Path *this_local;
  string *ext;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Path *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = HasExtension(this);
  if (bVar1) {
    uVar2 = std::__cxx11::string::find_last_of((char)this + '\b',0x2e);
    local_38 = uVar2;
    uVar3 = std::__cxx11::string::length();
    if (uVar2 < uVar3) {
      std::__cxx11::string::substr((ulong)local_58,(ulong)&this->m_string);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string(local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Path::Extension()			const
	{
		std::string ext;
		if( HasExtension() )
		{
			size_t pos = m_string.find_last_of( '.' );
			if( pos < m_string.length() )
			{
				ext = m_string.substr( pos );
			}
		}
		return ext;
	}